

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void vkt::memory::anon_unknown_0::createPipelineWithResources
               (DeviceInterface *vkd,VkDevice device,VkRenderPass renderPass,deUint32 subpass,
               VkShaderModule *vertexShaderModule,VkShaderModule *fragmentShaderModule,
               deUint32 viewPortWidth,deUint32 viewPortHeight,
               vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
               *vertexBindingDescriptions,
               vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
               *vertexAttributeDescriptions,
               vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               *bindings,VkPrimitiveTopology topology,deUint32 pushConstantRangeCount,
               VkPushConstantRange *pushConstantRanges,PipelineResources *resources)

{
  VkDescriptorSetLayoutBinding *pVVar1;
  VkDescriptorSetLayoutBinding *pVVar2;
  VkPipelineLayout obj;
  VkPipeline obj_00;
  undefined4 in_register_0000000c;
  ulong uVar3;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000003c;
  VkDescriptorSetLayout descriptorSetLayout_;
  VkRect2D scissors [1];
  VkDescriptorSetLayoutCreateInfo createInfo;
  VkPipelineLayoutCreateInfo createInfo_1;
  VkViewport viewports [1];
  VkPipelineColorBlendAttachmentState attachments [1];
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyState;
  VkPipelineMultisampleStateCreateInfo multisampleState;
  VkPipelineViewportStateCreateInfo viewportState;
  VkPipelineVertexInputStateCreateInfo vertexInputState;
  VkSampleMask local_34c;
  undefined1 local_348 [16];
  VkDevice local_338;
  VkPipelineShaderStageCreateInfo *pVStack_330;
  char *local_328;
  undefined8 local_320;
  undefined4 local_318;
  undefined8 local_310;
  undefined8 local_308;
  deUint64 local_300;
  char *local_2f8;
  undefined8 local_2f0;
  VkPipelineRasterizationStateCreateInfo *local_2e8;
  void *pvStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  Move<vk::Handle<(vk::HandleType)18>_> local_2a8;
  deUint64 local_288;
  DeviceInterface *pDStack_280;
  VkDevice local_278;
  VkAllocationCallbacks *pVStack_270;
  VkRect2D local_268;
  undefined1 local_258 [16];
  undefined8 local_248;
  VkPipelineShaderStageCreateInfo *pVStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  VkPipelineRasterizationStateCreateInfo *pVStack_1d0;
  VkPipelineVertexInputStateCreateInfo *local_1c8;
  VkPipelineInputAssemblyStateCreateInfo *local_1c0;
  VkPipelineTessellationStateCreateInfo *local_1b8;
  VkPipelineViewportStateCreateInfo *local_1b0;
  VkPipelineRasterizationStateCreateInfo *local_1a8;
  VkPipelineMultisampleStateCreateInfo *local_1a0;
  VkPipelineDepthStencilStateCreateInfo *local_198;
  VkPipelineColorBlendStateCreateInfo *local_190;
  VkPipelineDynamicStateCreateInfo *local_188;
  VkPipelineLayout local_180;
  VkRenderPass local_178;
  deUint32 local_170;
  VkPipeline local_168;
  deInt32 local_160;
  VkViewport local_158;
  VkPipelineColorBlendAttachmentState local_138;
  VkPipelineInputAssemblyStateCreateInfo local_118;
  VkPipelineMultisampleStateCreateInfo local_f8;
  VkPipelineViewportStateCreateInfo local_c8;
  VkPipelineVertexInputStateCreateInfo local_98;
  VkPipelineColorBlendStateCreateInfo local_68;
  
  pVVar1 = (VkDescriptorSetLayoutBinding *)
           (vertexAttributeDescriptions->
           super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (VkDescriptorSetLayoutBinding *)
           (vertexAttributeDescriptions->
           super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar1 != pVVar2) {
    local_258._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    local_258._8_8_ = (void *)0x0;
    local_248 = (VkDevice)
                ((ulong)(uint)((int)((ulong)((long)pVVar2 - (long)pVVar1) >> 3) * -0x55555555) <<
                0x20);
    pVStack_240 = (VkPipelineShaderStageCreateInfo *)pVVar1;
    ::vk::createDescriptorSetLayout
              ((Move<vk::Handle<(vk::HandleType)19>_> *)local_348,vkd,device,
               (VkDescriptorSetLayoutCreateInfo *)local_258,(VkAllocationCallbacks *)0x0);
    local_1d8 = local_338;
    pVStack_1d0 = (VkPipelineRasterizationStateCreateInfo *)pVStack_330;
    local_1e8._0_8_ = local_348._0_8_;
    local_1e8._8_8_ = local_348._8_8_;
    local_348._0_8_ = 0;
    local_348._8_8_ = (DeviceInterface *)0x0;
    local_338 = (VkDevice)0x0;
    pVStack_330 = (VkPipelineShaderStageCreateInfo *)0x0;
    if (*(deUint64 *)&pushConstantRanges[2].size != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)19>_> *)&pushConstantRanges[3].offset,
                 (VkDescriptorSetLayout)*(deUint64 *)&pushConstantRanges[2].size);
    }
    *(VkDevice *)(pushConstantRanges + 4) = local_1d8;
    *(VkPipelineRasterizationStateCreateInfo **)&pushConstantRanges[4].size = pVStack_1d0;
    *(undefined8 *)&pushConstantRanges[2].size = local_1e8._0_8_;
    pushConstantRanges[3].offset = local_1e8._8_4_;
    pushConstantRanges[3].size = local_1e8._12_4_;
    if (local_348._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_348 + 8),
                 (VkDescriptorSetLayout)local_348._0_8_);
    }
  }
  local_1c0 = (VkPipelineInputAssemblyStateCreateInfo *)
              CONCAT44(in_stack_0000003c,pushConstantRangeCount);
  local_2e8 = *(VkPipelineRasterizationStateCreateInfo **)&pushConstantRanges[2].size;
  local_1e8._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_1e8._8_8_ = (void *)0x0;
  pVStack_1d0 = local_2e8;
  if (local_2e8 != (VkPipelineRasterizationStateCreateInfo *)0x0) {
    pVStack_1d0 = (VkPipelineRasterizationStateCreateInfo *)&local_2e8;
  }
  local_1d8 = (VkDevice)
              ((ulong)(local_2e8 != (VkPipelineRasterizationStateCreateInfo *)0x0) << 0x20);
  local_1c8 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(local_1c8._4_4_,topology);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_348,vkd,device,
             (VkPipelineLayoutCreateInfo *)local_1e8,(VkAllocationCallbacks *)0x0);
  local_248 = local_338;
  pVStack_240 = pVStack_330;
  local_258._0_8_ = local_348._0_8_;
  local_258._8_8_ = local_348._8_8_;
  local_348._0_8_ = 0;
  local_348._8_8_ = (DeviceInterface *)0x0;
  local_338 = (VkDevice)0x0;
  pVStack_330 = (VkPipelineShaderStageCreateInfo *)0x0;
  obj.m_internal._0_4_ = pushConstantRanges[5].offset;
  obj.m_internal._4_4_ = pushConstantRanges[5].size;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(pushConstantRanges + 6),obj);
  }
  *(VkDevice *)&pushConstantRanges[6].size = local_248;
  *(VkPipelineShaderStageCreateInfo **)&pushConstantRanges[7].offset = pVStack_240;
  pushConstantRanges[5].offset = local_258._0_4_;
  pushConstantRanges[5].size = local_258._4_4_;
  pushConstantRanges[6].stageFlags = local_258._8_4_;
  pushConstantRanges[6].offset = local_258._12_4_;
  if (local_348._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_348 + 8),
               (VkPipelineLayout)local_348._0_8_);
  }
  local_348._0_4_ = 0x12;
  local_348._8_8_ = (DeviceInterface *)0x0;
  local_338 = (VkDevice)0x100000000;
  pVStack_330 = *(VkPipelineShaderStageCreateInfo **)CONCAT44(in_register_0000000c,subpass);
  local_328 = "main";
  local_320 = 0;
  local_318 = 0x12;
  local_310 = 0;
  local_308 = 0x1000000000;
  local_300 = vertexShaderModule->m_internal;
  local_2f8 = "main";
  local_2f0 = 0;
  local_198 = (VkPipelineDepthStencilStateCreateInfo *)local_258;
  local_258._8_8_ = (void *)0x0;
  local_248._0_4_ = 0;
  local_248._4_4_ = 0;
  uStack_220 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_258._0_8_ = 0x19;
  pVStack_240 = (VkPipelineShaderStageCreateInfo *)0x700000000;
  local_228 = 0x700000000;
  local_208 = 7;
  local_1f8 = 0x3f800000bf800000;
  local_1c8 = &local_98;
  local_98.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_98.pNext = (void *)0x0;
  local_98.flags = 0;
  local_98.pVertexBindingDescriptions =
       *(VkVertexInputBindingDescription **)CONCAT44(in_stack_00000014,viewPortHeight);
  uVar3 = ((long *)CONCAT44(in_stack_00000014,viewPortHeight))[1] -
          (long)local_98.pVertexBindingDescriptions;
  if (uVar3 == 0) {
    local_98.pVertexBindingDescriptions =
         (VkVertexInputBindingDescription *)(VkVertexInputAttributeDescription *)0x0;
  }
  local_98.vertexBindingDescriptionCount = (int)(uVar3 >> 2) * -0x55555555;
  local_98.pVertexAttributeDescriptions =
       (VkVertexInputAttributeDescription *)
       (vertexBindingDescriptions->
       super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
       )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(vertexBindingDescriptions->
                super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.pVertexAttributeDescriptions;
  if (uVar3 == 0) {
    local_98.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  }
  local_98.vertexAttributeDescriptionCount = (deUint32)(uVar3 >> 4);
  local_1c0 = &local_118;
  local_118.pNext = (void *)0x0;
  local_118.primitiveRestartEnable = 0;
  local_118._28_4_ = 0;
  local_118.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_118._4_4_ = 0;
  local_118._16_8_ = (long)bindings << 0x20;
  local_c8.pViewports = &local_158;
  local_158.x = 0.0;
  local_158.y = 0.0;
  local_268.extent.width = (deUint32)fragmentShaderModule;
  local_158.width = (float)((ulong)fragmentShaderModule & 0xffffffff);
  local_158.height = (float)viewPortWidth;
  local_158.minDepth = 0.0;
  local_158.maxDepth = 1.0;
  local_c8.pScissors = &local_268;
  local_268.offset.x = 0;
  local_268.offset.y = 0;
  local_268.extent.height = viewPortWidth;
  local_1b0 = &local_c8;
  local_c8.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_c8.pNext = (void *)0x0;
  local_c8.flags = 0;
  local_c8.viewportCount = 1;
  local_c8.scissorCount = 1;
  pvStack_2e0 = (void *)0x0;
  uStack_2d0._0_4_ = 0;
  uStack_2d0._4_4_ = VK_POLYGON_MODE_FILL;
  local_2b8._0_4_ = 0.0;
  local_2b8._4_4_ = 0.0;
  local_2c8._0_4_ = 0;
  local_2c8._4_4_ = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  uStack_2c0._0_4_ = 0;
  uStack_2c0._4_4_ = 0.0;
  local_2e8 = (VkPipelineRasterizationStateCreateInfo *)0x17;
  local_2d8._0_4_ = 0;
  local_2d8._4_4_ = 1;
  uStack_2b0._0_4_ = 1.0;
  uStack_2b0._4_4_ = 0;
  local_f8.pSampleMask = &local_34c;
  local_34c = 0xffffffff;
  local_1a0 = &local_f8;
  local_f8.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_f8.pNext = (void *)0x0;
  local_f8.flags = 0;
  local_f8.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_f8.sampleShadingEnable = 0;
  local_f8.minSampleShading = 0.0;
  local_f8.alphaToCoverageEnable = 0;
  local_f8.alphaToOneEnable = 0;
  local_68.pAttachments = &local_138;
  local_138.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  local_138.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_138.alphaBlendOp = VK_BLEND_OP_ADD;
  local_138.colorWriteMask = 0xf;
  local_138.blendEnable = 0;
  local_138.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  local_138.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_138.colorBlendOp = VK_BLEND_OP_ADD;
  local_190 = &local_68;
  local_68.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.logicOpEnable = 0;
  local_68.logicOp = VK_LOGIC_OP_COPY;
  local_68.attachmentCount = 1;
  local_68.blendConstants[0] = 0.0;
  local_68.blendConstants[1] = 0.0;
  local_68.blendConstants[2] = 0.0;
  local_68.blendConstants[3] = 0.0;
  local_1e8._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_1e8._8_8_ = (void *)0x0;
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 2;
  local_1b8 = (VkPipelineTessellationStateCreateInfo *)0x0;
  local_1a8 = (VkPipelineRasterizationStateCreateInfo *)&local_2e8;
  local_188 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_180.m_internal._0_4_ = pushConstantRanges[5].offset;
  local_180.m_internal._4_4_ = pushConstantRanges[5].size;
  local_170 = 0;
  local_168.m_internal = 0;
  local_160 = 0;
  pVStack_1d0 = (VkPipelineRasterizationStateCreateInfo *)local_348;
  local_178.m_internal = renderPass.m_internal;
  ::vk::createGraphicsPipeline
            (&local_2a8,vkd,device,(VkPipelineCache)0x0,(VkGraphicsPipelineCreateInfo *)local_1e8,
             (VkAllocationCallbacks *)0x0);
  local_278 = local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pVStack_270 = local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_288 = local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  pDStack_280 = local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                m_deviceIface;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal._0_4_ = pushConstantRanges->stageFlags;
  obj_00.m_internal._4_4_ = pushConstantRanges->offset;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&pushConstantRanges->size,obj_00);
  }
  *(VkDevice *)&pushConstantRanges[1].offset = local_278;
  *(VkAllocationCallbacks **)(pushConstantRanges + 2) = pVStack_270;
  pushConstantRanges->stageFlags = (undefined4)local_288;
  pushConstantRanges->offset = local_288._4_4_;
  *(DeviceInterface **)&pushConstantRanges->size = pDStack_280;
  if (local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_2a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void createPipelineWithResources (const vk::DeviceInterface&							vkd,
								  const vk::VkDevice									device,
								  const vk::VkRenderPass								renderPass,
								  const deUint32										subpass,
								  const vk::VkShaderModule&								vertexShaderModule,
								  const vk::VkShaderModule&								fragmentShaderModule,
								  const deUint32										viewPortWidth,
								  const deUint32										viewPortHeight,
								  const vector<vk::VkVertexInputBindingDescription>&	vertexBindingDescriptions,
								  const vector<vk::VkVertexInputAttributeDescription>&	vertexAttributeDescriptions,
								  const vector<vk::VkDescriptorSetLayoutBinding>&		bindings,
								  const vk::VkPrimitiveTopology							topology,
								  deUint32												pushConstantRangeCount,
								  const vk::VkPushConstantRange*						pushConstantRanges,
								  PipelineResources&									resources)
{
	if (!bindings.empty())
	{
		const vk::VkDescriptorSetLayoutCreateInfo createInfo =
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,

			0u,
			(deUint32)bindings.size(),
			bindings.empty() ? DE_NULL : &bindings[0]
		};

		resources.descriptorSetLayout = vk::createDescriptorSetLayout(vkd, device, &createInfo);
	}

	{
		const vk::VkDescriptorSetLayout			descriptorSetLayout_	= *resources.descriptorSetLayout;
		const vk::VkPipelineLayoutCreateInfo	createInfo				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,
			DE_NULL,
			0,

			resources.descriptorSetLayout ? 1u : 0u,
			resources.descriptorSetLayout ? &descriptorSetLayout_ : DE_NULL,

			pushConstantRangeCount,
			pushConstantRanges
		};

		resources.pipelineLayout = vk::createPipelineLayout(vkd, device, &createInfo);
	}

	{
		const vk::VkPipelineShaderStageCreateInfo			shaderStages[]					=
		{
			{
				vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				0,
				vk::VK_SHADER_STAGE_VERTEX_BIT,
				vertexShaderModule,
				"main",
				DE_NULL
			},
			{
				vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				0,
				vk::VK_SHADER_STAGE_FRAGMENT_BIT,
				fragmentShaderModule,
				"main",
				DE_NULL
			}
		};
		const vk::VkPipelineDepthStencilStateCreateInfo		depthStencilState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,
			DE_NULL,
			0u,
			DE_FALSE,
			DE_FALSE,
			vk::VK_COMPARE_OP_ALWAYS,
			DE_FALSE,
			DE_FALSE,
			{
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_COMPARE_OP_ALWAYS,
				0u,
				0u,
				0u,
			},
			{
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_COMPARE_OP_ALWAYS,
				0u,
				0u,
				0u,
			},
			-1.0f,
			+1.0f
		};
		const vk::VkPipelineVertexInputStateCreateInfo		vertexInputState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,
			DE_NULL,
			0u,

			(deUint32)vertexBindingDescriptions.size(),
			vertexBindingDescriptions.empty() ? DE_NULL : &vertexBindingDescriptions[0],

			(deUint32)vertexAttributeDescriptions.size(),
			vertexAttributeDescriptions.empty() ? DE_NULL : &vertexAttributeDescriptions[0]
		};
		const vk::VkPipelineInputAssemblyStateCreateInfo	inputAssemblyState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,
			DE_NULL,
			0,
			topology,
			VK_FALSE
		};
		const vk::VkViewport								viewports[]						=
		{
			{ 0.0f, 0.0f, (float)viewPortWidth, (float)viewPortHeight, 0.0f, 1.0f }
		};
		const vk::VkRect2D									scissors[]						=
		{
			{ { 0, 0 }, { (deUint32)viewPortWidth, (deUint32)viewPortHeight } }
		};
		const vk::VkPipelineViewportStateCreateInfo			viewportState					=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,
			DE_NULL,
			0,
			DE_LENGTH_OF_ARRAY(viewports),
			viewports,
			DE_LENGTH_OF_ARRAY(scissors),
			scissors
		};
		const vk::VkPipelineRasterizationStateCreateInfo	rasterState						=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,
			DE_NULL,
			0,

			VK_TRUE,
			VK_FALSE,
			vk::VK_POLYGON_MODE_FILL,
			vk::VK_CULL_MODE_NONE,
			vk::VK_FRONT_FACE_COUNTER_CLOCKWISE,
			VK_FALSE,
			0.0f,
			0.0f,
			0.0f,
			1.0f
		};
		const vk::VkSampleMask								sampleMask						= ~0u;
		const vk::VkPipelineMultisampleStateCreateInfo		multisampleState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,
			DE_NULL,
			0,

			vk::VK_SAMPLE_COUNT_1_BIT,
			VK_FALSE,
			0.0f,
			&sampleMask,
			VK_FALSE,
			VK_FALSE
		};
		const vk::VkPipelineColorBlendAttachmentState		attachments[]					=
		{
			{
				VK_FALSE,
				vk::VK_BLEND_FACTOR_ONE,
				vk::VK_BLEND_FACTOR_ZERO,
				vk::VK_BLEND_OP_ADD,
				vk::VK_BLEND_FACTOR_ONE,
				vk::VK_BLEND_FACTOR_ZERO,
				vk::VK_BLEND_OP_ADD,
				(vk::VK_COLOR_COMPONENT_R_BIT|
				 vk::VK_COLOR_COMPONENT_G_BIT|
				 vk::VK_COLOR_COMPONENT_B_BIT|
				 vk::VK_COLOR_COMPONENT_A_BIT)
			}
		};
		const vk::VkPipelineColorBlendStateCreateInfo		colorBlendState					=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,
			DE_NULL,
			0,

			VK_FALSE,
			vk::VK_LOGIC_OP_COPY,
			DE_LENGTH_OF_ARRAY(attachments),
			attachments,
			{ 0.0f, 0.0f, 0.0f, 0.0f }
		};
		const vk::VkGraphicsPipelineCreateInfo				createInfo						=
		{
			vk::VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,
			DE_NULL,
			0u,

			DE_LENGTH_OF_ARRAY(shaderStages),
			shaderStages,

			&vertexInputState,
			&inputAssemblyState,
			DE_NULL,
			&viewportState,
			&rasterState,
			&multisampleState,
			&depthStencilState,
			&colorBlendState,
			DE_NULL,
			*resources.pipelineLayout,
			renderPass,
			subpass,
			0,
			0
		};

		resources.pipeline = vk::createGraphicsPipeline(vkd, device, 0, &createInfo);
	}
}